

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::SuperNewDefaultedArgsExpressionSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,SuperNewDefaultedArgsExpressionSyntax *this,
          size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (SuperNewDefaultedArgsExpressionSyntax *)0x0:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[1].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (SuperNewDefaultedArgsExpressionSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (SuperNewDefaultedArgsExpressionSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 3;
    break;
  case (SuperNewDefaultedArgsExpressionSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 4;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax SuperNewDefaultedArgsExpressionSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return scopedNew.get();
        case 1: return &openParen;
        case 2: return &defaultKeyword;
        case 3: return &closeParen;
        default: return nullptr;
    }
}